

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void mp::format(BasicFormatter<char,_fmt::ArgFormatter<char>_> *f,char **param_2,NumericExpr e)

{
  BasicStringRef<char> value;
  BasicMemoryWriter<char,_std::allocator<char>_> *this;
  size_t size;
  UI *in_RDX;
  UI_STRING *uis;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_RDI;
  MemoryWriter writer;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  UI *pUVar1;
  int in_stack_fffffffffffffd94;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_fffffffffffffd98;
  ExprBase in_stack_fffffffffffffda0;
  allocator<char> local_241;
  undefined1 local_240 [560];
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *local_10;
  UI *local_8;
  
  alloc = &local_241;
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd70,alloc);
  std::allocator<char>::~allocator(&local_241);
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::ExprWriter
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)&stack0xfffffffffffffd90,
             local_240);
  pUVar1 = local_8;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            (in_stack_fffffffffffffd98,(NumericExpr)in_stack_fffffffffffffda0.impl_,
             in_stack_fffffffffffffd94);
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::~ExprWriter
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)0x191bb7);
  fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::writer(local_10,local_8,uis);
  this = (BasicMemoryWriter<char,_std::allocator<char>_> *)
         fmt::BasicWriter<char>::data((BasicWriter<char> *)0x191bd9);
  size = fmt::BasicWriter<char>::size((BasicWriter<char> *)0x191be7);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)&stack0xfffffffffffffd70,(char *)this,size);
  value.size_ = (size_t)pUVar1;
  value.data_ = in_stack_fffffffffffffd78;
  fmt::BasicWriter<char>::operator<<(&in_stack_fffffffffffffd70->super_BasicWriter<char>,value);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this);
  return;
}

Assistant:

void mp::format(fmt::BasicFormatter<char> &f, const char *&, NumericExpr e) {
  fmt::MemoryWriter writer;
  ExprWriter<internal::ExprTypes>(writer).Visit(e);
  f.writer() << fmt::StringRef(writer.data(), writer.size());
}